

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void glcts::prepareDepthTextureFace
               (Functions *gl,GLint cube_face,GLint element_index,GLint mipmap_level,
               GLint n_elements,GLint n_mipmap_levels,GLenum texture_format,GLenum texture_type,
               GLsizei texture_width,GLsizei texture_height)

{
  TestError *this;
  
  if (texture_type == 0x1406) {
    prepareDataForDepthFloatTexture
              (gl,cube_face,element_index,mipmap_level,n_elements,n_mipmap_levels,texture_format,
               0x1406,texture_width,texture_height);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Not implemented case !",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
             ,0x3fe);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void prepareDepthTextureFace(const glw::Functions& gl, glw::GLint cube_face, glw::GLint element_index,
							 glw::GLint mipmap_level, glw::GLint n_elements, glw::GLint n_mipmap_levels,
							 glw::GLenum texture_format, glw::GLenum texture_type, glw::GLsizei texture_width,
							 glw::GLsizei texture_height)
{
	switch (texture_type)
	{
	case GL_FLOAT:
		prepareDataForDepthFloatTexture(gl, cube_face, element_index, mipmap_level, n_elements, n_mipmap_levels,
										texture_format, texture_type, texture_width, texture_height);
		break;

	default:
		TCU_FAIL("Not implemented case !");
		break;
	}
}